

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wildmidi_lib.cpp
# Opt level: O0

_patch * get_patch_data(unsigned_short patchid)

{
  _patch *local_20;
  _patch *search_patch;
  _patch *p_Stack_10;
  unsigned_short patchid_local;
  
  FCriticalSection::Enter(&patch_lock);
  local_20 = patch[(int)(patchid & 0x7f)];
  if (local_20 == (_patch *)0x0) {
    FCriticalSection::Leave(&patch_lock);
    p_Stack_10 = (_patch *)0x0;
  }
  else {
    for (; local_20 != (_patch *)0x0; local_20 = local_20->next) {
      if (local_20->patchid == patchid) {
        FCriticalSection::Leave(&patch_lock);
        return local_20;
      }
    }
    if ((int)(uint)patchid >> 8 == 0) {
      FCriticalSection::Leave(&patch_lock);
      p_Stack_10 = (_patch *)0x0;
    }
    else {
      FCriticalSection::Leave(&patch_lock);
      p_Stack_10 = get_patch_data(patchid & 0xff);
    }
  }
  return p_Stack_10;
}

Assistant:

static struct _patch *
get_patch_data(unsigned short patchid) {
	struct _patch *search_patch;

	patch_lock.Enter();

	search_patch = patch[patchid & 0x007F];

	if (search_patch == NULL) {
		patch_lock.Leave();
		return NULL;
	}

	while (search_patch) {
		if (search_patch->patchid == patchid) {
			patch_lock.Leave();
			return search_patch;
		}
		search_patch = search_patch->next;
	}
	if ((patchid >> 8) != 0) {
		patch_lock.Leave();
		return (get_patch_data(patchid & 0x00FF));
	}
	patch_lock.Leave();
	return NULL;
}